

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  
  if (column->SortOrder == -1) {
    uVar1 = column->SortDirectionsAvailList & 3;
  }
  else {
    bVar3 = 1;
    uVar1 = 0;
    for (iVar2 = 0; iVar2 != 6; iVar2 = iVar2 + 2) {
      if ((column->SortDirectionsAvailList >> ((byte)iVar2 & 0x1f) & 3) == (column->field_0x64 & 3))
      {
        return column->SortDirectionsAvailList >>
               (bVar3 % ((byte)column->field_0x64 >> 2 & 3)) * '\x02' & 3;
      }
      bVar3 = bVar3 + 1;
    }
  }
  return uVar1;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}